

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

void __thiscall
SuffixTree::GeneralizedSuffixTree::BuildSuffixTreeFromFile
          (GeneralizedSuffixTree *this,string *filename)

{
  uint *puVar1;
  char cVar2;
  bool bVar3;
  uint letter;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  Node *pNVar8;
  pointer pbVar9;
  Node *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong uVar12;
  uint pos;
  int iVar13;
  uint string;
  ulong uVar14;
  undefined1 local_468 [8];
  char strbuf [1024];
  allocator<char> local_35;
  int local_34;
  
  puts("Loading strings...");
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_468,"Can not open file: ",(allocator<char> *)(strbuf + 0x3f8));
    std::operator+(pbVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_468,filename);
    __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  uVar12 = 0;
  while( true ) {
    pcVar5 = fgets(local_468,0x400,__stream);
    if (pcVar5 == (char *)0x0) break;
    sVar6 = strlen(local_468);
    iVar13 = (int)sVar6;
    if (iVar13 != 0) {
      local_34 = (int)uVar12;
      local_468[iVar13 - 1] = 0;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (strbuf + 0x3f8);
      std::__cxx11::string::string<std::allocator<char>>((string *)pbVar11,local_468,&local_35);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,pbVar11);
      std::__cxx11::string::~string((string *)pbVar11);
      uVar12 = (ulong)(uint)(local_34 + iVar13);
    }
  }
  fclose(__stream);
  puts("\r\rStrings were loaded successfully");
  if ((int)uVar12 == 0) {
    pcVar5 = (char *)malloc(0x60);
    sVar6 = 0x10;
  }
  else {
    pcVar5 = (char *)malloc(uVar12 * 0x60);
    sVar6 = uVar12 << 4;
  }
  pcVar7 = (char *)malloc(sVar6);
  this->nodes = pcVar5;
  this->leaves = pcVar7;
  string = 0;
  pNVar8 = AllocNode(this,(Node *)0x0,(Node *)0x0);
  this->root = pNVar8;
  pNVar8->suffix_link = pNVar8;
  this->active_node = pNVar8;
  this->active_edge = 0;
  this->active_length = 0;
  this->remainder = 0;
  pbVar9 = (this->strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar14 = (ulong)string;
    uVar12 = (long)(this->strings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
    if (uVar12 <= uVar14) {
      puts("\rTree was built successfully");
      return;
    }
    printf("\rBuilding tree: %.2f %%",(double)(((float)uVar14 * 100.0) / (float)uVar12));
    pos = 0;
    while( true ) {
      pbVar9 = (this->strings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar9[uVar14]._M_string_length < (ulong)pos) break;
      cVar2 = pbVar9[uVar14]._M_dataplus._M_p[pos];
      local_34 = (int)cVar2;
      letter = (int)cVar2;
      if (cVar2 == '\0') {
        letter = string << 8;
      }
      iVar13 = 1;
      pNVar8 = (Node *)0x0;
LAB_00105848:
      while( true ) {
        puVar1 = &this->remainder;
        *puVar1 = *puVar1 + iVar13;
        if (*puVar1 == 0) break;
        pNVar10 = this->active_node;
        bVar3 = AddSymbol(this,(char)local_34);
        if (bVar3) {
          if (pNVar8 != (Node *)0x0) {
            pNVar8->suffix_link = pNVar10;
          }
          break;
        }
        if (this->active_length == 0) {
          InsertLeaf(this,letter,string,pos);
          pNVar10 = this->active_node;
        }
        else {
          pNVar10 = InsertNode(this,letter,string,pos);
        }
        if (pNVar8 != (Node *)0x0) {
          pNVar8->suffix_link = pNVar10;
        }
        pNVar8 = pNVar10;
        if (this->active_node == this->root) goto LAB_001058c3;
        this->active_node = this->active_node->suffix_link;
        uVar4 = this->active_length;
        iVar13 = -1;
        if (uVar4 != 0) goto LAB_001058d9;
      }
      pos = pos + 1;
    }
    string = string + 1;
  } while( true );
LAB_001058c3:
  iVar13 = -1;
  if (this->active_length != 0) {
    uVar4 = this->active_length - 1;
    this->active_length = uVar4;
LAB_001058d9:
    Move(this,string,pos - uVar4);
    iVar13 = -1;
  }
  goto LAB_00105848;
}

Assistant:

void GeneralizedSuffixTree::BuildSuffixTreeFromFile (std::string filename)
{
    // load strings from file
    printf ("Loading strings...\n");
    FILE *file = fopen (filename.c_str(), "r");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    char strbuf[1024];
    uint symbols_num = 0;
    while (fgets (strbuf, 1024, file))
    {
        uint len = strlen (strbuf);
        if (len > 0)
        {
            strbuf[len - 1] = '\0';
            strings.push_back (strbuf);
            symbols_num += len;
        }
    }
    fclose (file);
    printf ("\r\rStrings were loaded successfully\n");
    // allocate space for nodes and leaves
	if (symbols_num)
	{
		nodes = static_cast<char *> (malloc (symbols_num * sizeof (Node)));
		leaves = static_cast<char *> (malloc (symbols_num * sizeof (Leaf)));
	}
    else
	{
		nodes = static_cast<char *> (malloc (sizeof (Node)));
		leaves = static_cast<char *> (malloc (sizeof (Leaf)));
	}
    // build tree
    root = AllocNode (nullptr, nullptr);
    root->suffix_link = root;
    active_node = root;
    active_edge = 0;
    active_length = 0;
    remainder = 0;
    for (uint i = 0; i < strings.size(); ++i)
    {
        printf ("\rBuilding tree: %.2f %%", i * 100.0f / strings.size());
        for (uint j = 0; j <= strings[i].size(); ++j)
        {
            char symbol = strings[i][j];
            uint letter = MakeLetter (symbol, i);
            Node *last_inserted_node = nullptr;
            ++remainder;
            while (remainder)
            {
                // try add symbol
                Node *old_active_node = active_node;
                if (AddSymbol (symbol))
                {
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = old_active_node;
                    break;
                }
                // insert node or leaf
                if (active_length)
                {
                    // insert node
                    Node *node = InsertNode (letter, i, j);
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = node;
                    last_inserted_node = node;
                }
                else
                {
                    // insert leaf
                    InsertLeaf (letter, i, j);
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = active_node;
                    last_inserted_node = active_node;
                }
                // move to next active point
                if (active_node != root)
                {
                    active_node = active_node->suffix_link;
                    if (active_length)
                        Move (i, j - active_length);
                }
                else if (active_length)
                {
                    --active_length;
                    Move (i, j - active_length);
                }
                --remainder;
            }
        }
    }
    printf ("\rTree was built successfully\n");
}